

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeTry(Ref try_,Ref arg,Ref catch_)

{
  Ref *pRVar1;
  ulong uVar2;
  Value *pVVar3;
  Ref r;
  Ref local_30;
  Ref local_28;
  Ref catch__local;
  Ref arg_local;
  Ref try__local;
  
  local_28.inst = catch_.inst;
  catch__local = arg;
  arg_local = try_;
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&arg_local);
  uVar2 = cashew::Ref::operator==(pRVar1,(IString *)&BLOCK);
  if ((uVar2 & 1) == 0) {
    __assert_fail("try_[0] == BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6fd,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
  }
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  uVar2 = cashew::Ref::operator==(pRVar1,(IString *)&BLOCK);
  if ((uVar2 & 1) == 0) {
    __assert_fail("catch_[0] == BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6fe,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
  }
  local_30 = makeRawArray(3);
  pVVar3 = Ref::operator->(&local_30);
  r = makeRawString((IString *)&TRY);
  pVVar3 = Value::push_back(pVVar3,r);
  pVVar3 = Value::push_back(pVVar3,arg_local);
  pVVar3 = Value::push_back(pVVar3,catch__local);
  pVVar3 = Value::push_back(pVVar3,local_28);
  Ref::Ref(&try__local,pVVar3);
  return (Ref)try__local.inst;
}

Assistant:

static Ref makeTry(Ref try_, Ref arg, Ref catch_) {
    assert(try_[0] == BLOCK);
    assert(catch_[0] == BLOCK);
    return &makeRawArray(3)
              ->push_back(makeRawString(TRY))
              .push_back(try_)
              .push_back(arg)
              .push_back(catch_);
  }